

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMan.c
# Opt level: O0

Mpm_Man_t * Mpm_ManStart(Mig_Man_t *pMig,Mpm_Par_t *pPars)

{
  int iVar1;
  Mpm_Man_t *p_00;
  Mmr_Step_t *pMVar2;
  Vec_Ptr_t *pVVar3;
  Vec_Mem_t *pVVar4;
  abctime aVar5;
  int local_28;
  int local_24;
  int i;
  Mpm_Man_t *p;
  Mpm_Par_t *pPars_local;
  Mig_Man_t *pMig_local;
  
  if (0x20 < pPars->nNumCuts) {
    __assert_fail("pPars->nNumCuts <= MPM_CUT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmMan.c"
                  ,0x32,"Mpm_Man_t *Mpm_ManStart(Mig_Man_t *, Mpm_Par_t *)");
  }
  if ((pPars->fUseTruth != 0) && (0x10 < pPars->pLib->LutMax)) {
    __assert_fail("!pPars->fUseTruth || pPars->pLib->LutMax <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmMan.c"
                  ,0x33,"Mpm_Man_t *Mpm_ManStart(Mig_Man_t *, Mpm_Par_t *)");
  }
  if ((pPars->fUseDsd != 0) && (6 < pPars->pLib->LutMax)) {
    __assert_fail("!pPars->fUseDsd || pPars->pLib->LutMax <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmMan.c"
                  ,0x34,"Mpm_Man_t *Mpm_ManStart(Mig_Man_t *, Mpm_Par_t *)");
  }
  Mig_ManSetRefs(pMig);
  p_00 = (Mpm_Man_t *)calloc(1,0x3688);
  p_00->pMig = pMig;
  p_00->pPars = pPars;
  p_00->pLibLut = pPars->pLib;
  p_00->nLutSize = pPars->pLib->LutMax;
  if (pPars->fUseTruth == 0) {
    local_28 = 0;
  }
  else {
    local_28 = Abc_Truth6WordNum(p_00->nLutSize);
  }
  p_00->nTruWords = local_28;
  p_00->nNumCuts = pPars->nNumCuts;
  iVar1 = Mpm_CutWordNum(0x20);
  if (0x1f < iVar1) {
    __assert_fail("Mpm_CutWordNum(32) < 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmMan.c"
                  ,0x3f,"Mpm_Man_t *Mpm_ManStart(Mig_Man_t *, Mpm_Par_t *)");
  }
  iVar1 = Mpm_CutWordNum(p_00->nLutSize);
  iVar1 = Abc_Base2Log(iVar1 + 1);
  pMVar2 = Mmr_StepStart(0xd,iVar1);
  p_00->pManCuts = pMVar2;
  Vec_PtrGrow(&p_00->vFreeUnits,p_00->nNumCuts + 1);
  for (local_24 = p_00->nNumCuts; -1 < local_24; local_24 = local_24 + -1) {
    Vec_PtrPush(&p_00->vFreeUnits,p_00->pCutUnits + local_24);
  }
  pVVar3 = Vec_PtrAlloc(1000);
  p_00->vTemp = pVVar3;
  iVar1 = Mig_ManObjNum(pMig);
  Vec_IntFill(&p_00->vCutBests,iVar1,0);
  iVar1 = Mig_ManObjNum(pMig);
  Vec_IntFill(&p_00->vCutLists,iVar1,0);
  iVar1 = Mig_ManObjNum(pMig);
  Vec_IntFill(&p_00->vMigRefs,iVar1,0);
  iVar1 = Mig_ManObjNum(pMig);
  Vec_IntFill(&p_00->vMapRefs,iVar1,0);
  iVar1 = Mig_ManObjNum(pMig);
  Vec_IntFill(&p_00->vEstRefs,iVar1,0);
  iVar1 = Mig_ManObjNum(pMig);
  Vec_IntFill(&p_00->vRequireds,iVar1,1000000000);
  iVar1 = Mig_ManObjNum(pMig);
  Vec_IntFill(&p_00->vTimes,iVar1,0);
  iVar1 = Mig_ManObjNum(pMig);
  Vec_IntFill(&p_00->vAreas,iVar1,0);
  iVar1 = Mig_ManObjNum(pMig);
  Vec_IntFill(&p_00->vEdges,iVar1,0);
  if ((p_00->pPars->fUseTruth != 0) && (p_00->pPars->fUseDsd != 0)) {
    __assert_fail("!p->pPars->fUseTruth || !p->pPars->fUseDsd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmMan.c"
                  ,0x50,"Mpm_Man_t *Mpm_ManStart(Mig_Man_t *, Mpm_Par_t *)");
  }
  if (p_00->pPars->fUseTruth == 0) {
    if (p_00->pPars->fUseDsd != 0) {
      Mpm_ManPrecomputePerms(p_00);
      p_00->funcVar0 = 1;
    }
  }
  else {
    pVVar4 = Vec_MemAlloc(p_00->nTruWords,0xc);
    p_00->vTtMem = pVVar4;
    Vec_MemHashAlloc(p_00->vTtMem,10000);
    iVar1 = Vec_MemHashInsert(p_00->vTtMem,p_00->Truth);
    p_00->funcCst0 = iVar1;
    Abc_TtUnit(p_00->Truth,p_00->nTruWords,0);
    iVar1 = Vec_MemHashInsert(p_00->vTtMem,p_00->Truth);
    p_00->funcVar0 = iVar1;
  }
  aVar5 = Abc_Clock();
  p_00->timeTotal = aVar5;
  pMig->pMan = p_00;
  return p_00;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Mpm_Man_t * Mpm_ManStart( Mig_Man_t * pMig, Mpm_Par_t * pPars )
{
    Mpm_Man_t * p;
    int i;
    assert( sizeof(Mpm_Uni_t) % sizeof(word) == 0 );      // aligned info to word boundary
    assert( pPars->nNumCuts <= MPM_CUT_MAX );
    assert( !pPars->fUseTruth || pPars->pLib->LutMax <= 16 );
    assert( !pPars->fUseDsd || pPars->pLib->LutMax <= 6 );
    Mig_ManSetRefs( pMig );
    // alloc
    p = ABC_CALLOC( Mpm_Man_t, 1 );
    p->pMig      = pMig;
    p->pPars     = pPars;
    p->pLibLut   = pPars->pLib;
    p->nLutSize  = pPars->pLib->LutMax;
    p->nTruWords = pPars->fUseTruth ? Abc_Truth6WordNum(p->nLutSize) : 0;
    p->nNumCuts  = pPars->nNumCuts;
    // cuts
    assert( Mpm_CutWordNum(32) < 32 ); // using 5 bits for word count
    p->pManCuts  = Mmr_StepStart( 13, Abc_Base2Log(Mpm_CutWordNum(p->nLutSize) + 1) );
    Vec_PtrGrow( &p->vFreeUnits, p->nNumCuts + 1 );
    for ( i = p->nNumCuts; i >= 0; i-- )
        Vec_PtrPush( &p->vFreeUnits, p->pCutUnits + i );
    p->vTemp     = Vec_PtrAlloc( 1000 );
    // mapping attributes
    Vec_IntFill( &p->vCutBests, Mig_ManObjNum(pMig), 0 );
    Vec_IntFill( &p->vCutLists, Mig_ManObjNum(pMig), 0 );
    Vec_IntFill( &p->vMigRefs, Mig_ManObjNum(pMig), 0 );
    Vec_IntFill( &p->vMapRefs, Mig_ManObjNum(pMig), 0 );
    Vec_IntFill( &p->vEstRefs, Mig_ManObjNum(pMig), 0 );
    Vec_IntFill( &p->vRequireds, Mig_ManObjNum(pMig), ABC_INFINITY );
    Vec_IntFill( &p->vTimes, Mig_ManObjNum(pMig), 0 );
    Vec_IntFill( &p->vAreas, Mig_ManObjNum(pMig), 0 );
    Vec_IntFill( &p->vEdges, Mig_ManObjNum(pMig), 0 );
    // start DSD manager
    assert( !p->pPars->fUseTruth || !p->pPars->fUseDsd );
    if ( p->pPars->fUseTruth )
    { 
        p->vTtMem = Vec_MemAlloc( p->nTruWords, 12 ); // 32 KB/page for 6-var functions
        Vec_MemHashAlloc( p->vTtMem, 10000 );
        p->funcCst0 = Vec_MemHashInsert( p->vTtMem, p->Truth );
        Abc_TtUnit( p->Truth, p->nTruWords, 0 );
        p->funcVar0 = Vec_MemHashInsert( p->vTtMem, p->Truth );
    }
    else if ( p->pPars->fUseDsd )
    {
        Mpm_ManPrecomputePerms( p );
        p->funcVar0 = 1;
    }
    // finish
    p->timeTotal = Abc_Clock();
    pMig->pMan = p;
    return p;
}